

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O0

LazyObject * __thiscall Assimp::FBX::Document::GetObject(Document *this,uint64_t id)

{
  bool bVar1;
  reference ppVar2;
  LazyObject *local_38;
  _Self local_28;
  _Self local_20;
  const_iterator it;
  uint64_t id_local;
  Document *this_local;
  
  it._M_node = (_Base_ptr)id;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
       ::find(&this->objects,(key_type_conflict1 *)&it);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
       ::end(&this->objects);
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    local_38 = (LazyObject *)0x0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>::
             operator*(&local_20);
    local_38 = ppVar2->second;
  }
  return local_38;
}

Assistant:

LazyObject* Document::GetObject(uint64_t id) const
{
    ObjectMap::const_iterator it = objects.find(id);
    return it == objects.end() ? nullptr : (*it).second;
}